

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

Box2i __thiscall
Imf_2_5::dataWindowForTile
          (Imf_2_5 *this,TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy
          ,int lx,int ly)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Box2i BVar5;
  Imf_2_5 local_40 [8];
  int local_38;
  int local_34;
  
  iVar4 = tileDesc->xSize * dx + minX;
  iVar2 = tileDesc->ySize * dy + minY;
  iVar1 = tileDesc->xSize + iVar4 + -1;
  iVar3 = (tileDesc->ySize - 1) + iVar2;
  BVar5 = dataWindowForLevel(local_40,tileDesc,minX,maxX,minY,maxY,lx,ly);
  if (local_38 < iVar1) {
    iVar1 = local_38;
  }
  if (local_34 < iVar3) {
    iVar3 = local_34;
  }
  *(int *)this = iVar4;
  *(int *)(this + 4) = iVar2;
  *(int *)(this + 8) = iVar1;
  *(int *)(this + 0xc) = iVar3;
  BVar5.min = (Vec2<int>)this;
  return BVar5;
}

Assistant:

Box2i
dataWindowForTile (const TileDescription &tileDesc,
		   int minX, int maxX,
		   int minY, int maxY,
		   int dx, int dy,
		   int lx, int ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize,
		       minY + dy * tileDesc.ySize);

    V2i tileMax = tileMin + V2i (tileDesc.xSize - 1, tileDesc.ySize - 1);

    V2i levelMax = dataWindowForLevel
		       (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    tileMax = V2i (std::min (tileMax[0], levelMax[0]),
		   std::min (tileMax[1], levelMax[1]));

    return Box2i (tileMin, tileMax);
}